

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astSequenceNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  undefined8 *local_a0;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t *psStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_tuple_t sStack_80;
  sysbvm_tuple_t *local_78;
  undefined8 *local_70;
  sysbvm_tuple_t local_68;
  sysbvm_stackFrameRecord_t local_60;
  undefined8 local_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined8 **local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_30 = &local_a0;
  local_88 = 0;
  sStack_80 = 0;
  local_98 = 0;
  psStack_90 = (sysbvm_tuple_t *)0x0;
  local_a0 = (undefined8 *)0x2f;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 5;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_60.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_60.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_50 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_60);
  uVar3 = *(ulong *)(*arguments + 0x30);
  if (((uVar3 & 0xf) == 0 && uVar3 != 0) && (uVar1 = *(uint *)(uVar3 + 0xc), 7 < uVar1)) {
    uVar3 = 0;
    do {
      uVar2 = *(ulong *)(*arguments + 0x30);
      if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
        local_98 = *(sysbvm_tuple_t *)(uVar2 + 0x10 + uVar3 * 8);
      }
      else {
        local_98 = 0;
      }
      local_a0 = (undefined8 *)
                 sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                           (context,local_98,arguments[1]);
      uVar2 = (ulong)local_a0 & 0xf;
      if (uVar2 == 0 && local_a0 != (undefined8 *)0x0) {
        psStack_90 = (sysbvm_tuple_t *)*local_a0;
      }
      else if ((int)uVar2 == 0xf) {
        psStack_90 = (sysbvm_tuple_t *)
                     sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)local_a0 >> 4);
      }
      else {
        psStack_90 = (sysbvm_tuple_t *)sysbvm_tuple_getImmediateTypeWithTag(context,uVar2);
      }
      uVar2 = (ulong)psStack_90 & 0xf;
      if (uVar2 == 0 && psStack_90 != (sysbvm_tuple_t *)0x0) {
        local_88 = *psStack_90;
      }
      else if ((int)uVar2 == 0xf) {
        local_88 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psStack_90 >> 4);
      }
      else {
        local_88 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar2);
      }
      sStack_80 = sysbvm_type_getAnalyzeAndEvaluateConcreteMetaValueWithEnvironmentFunction
                            (context,local_88);
      if (sStack_80 != 0) {
        local_68 = arguments[1];
        local_78 = psStack_90;
        local_70 = local_a0;
        local_a0 = (undefined8 *)
                   sysbvm_function_apply(context,sStack_80,3,(sysbvm_tuple_t *)&local_78,1);
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 >> 3 != uVar3);
  }
  sysbvm_stackFrame_popRecord(&local_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return (sysbvm_tuple_t)local_a0;
}

Assistant:

static sysbvm_tuple_t sysbvm_astSequenceNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_tuple_t result;
        sysbvm_tuple_t expression;
        sysbvm_tuple_t elementType;
        sysbvm_tuple_t elementMetaType;
        sysbvm_tuple_t concretizeFunction;
    } gcFrame = {
        .result = SYSBVM_VOID_TUPLE
    };

    sysbvm_astSequenceNode_t **sequenceNode = (sysbvm_astSequenceNode_t**)node;

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*sequenceNode)->super.sourcePosition);

    size_t expressionCount = sysbvm_array_getSize((*sequenceNode)->expressions);
    for(size_t i = 0; i < expressionCount; ++i)
    {
        gcFrame.expression = sysbvm_array_at((*sequenceNode)->expressions, i);
        gcFrame.result = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, gcFrame.expression, *environment);
        
        gcFrame.elementType = sysbvm_tuple_getType(context, gcFrame.result);
        gcFrame.elementMetaType = sysbvm_tuple_getType(context, gcFrame.elementType);
        gcFrame.concretizeFunction = sysbvm_type_getAnalyzeAndEvaluateConcreteMetaValueWithEnvironmentFunction(context, gcFrame.elementMetaType);
        if(gcFrame.concretizeFunction)
            gcFrame.result = sysbvm_function_applyNoCheck3(context, gcFrame.concretizeFunction, gcFrame.elementType, gcFrame.result, *environment);
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}